

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O1

void __thiscall xmrig::CpuBackend::start(CpuBackend *this,IWorker *worker,bool ready)

{
  size_t *psVar1;
  CpuBackendPrivate *pCVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  CpuLaunchStatus *pCVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar9 != 0) {
    std::__throw_system_error(iVar9);
  }
  pCVar2 = this->d_ptr;
  if (ready) {
    iVar9 = (*worker->_vptr_IWorker[3])(worker);
    uVar13 = *(long *)CONCAT44(extraout_var,iVar9) + 0x1fffffU >> 0x15;
    psVar1 = &(pCVar2->status).m_hugePages;
    *psVar1 = *psVar1 + (uVar13 & -(ulong)((uint)((long *)CONCAT44(extraout_var,iVar9))[2] & 1));
    (pCVar2->status).m_pages = uVar13 + (pCVar2->status).m_pages;
    (pCVar2->status).m_started = (pCVar2->status).m_started + 1;
    iVar9 = (*worker->_vptr_IWorker[5])(worker);
    lVar10 = CONCAT44(extraout_var_00,iVar9);
    pCVar11 = (CpuLaunchStatus *)&(pCVar2->status).m_ways;
  }
  else {
    pCVar11 = &pCVar2->status;
    lVar10 = 1;
  }
  pCVar11->m_errors = pCVar11->m_errors + lVar10;
  if ((pCVar2->status).m_errors + (pCVar2->status).m_started == (pCVar2->status).m_threads) {
    pCVar2 = this->d_ptr;
    sVar3 = (pCVar2->status).m_started;
    if (sVar3 == 0) {
      Log::print(ERR,"%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (failed to start threads)\x1b[0m",
                 "\x1b[46;1m\x1b[1;37m cpu \x1b[0m");
    }
    else {
      pcVar12 = "\x1b[1;36m";
      if ((pCVar2->status).m_errors != 0) {
        pcVar12 = "\x1b[1;33m";
      }
      sVar4 = (pCVar2->status).m_threads;
      sVar5 = (pCVar2->status).m_ways;
      sVar6 = (pCVar2->status).m_hugePages;
      sVar7 = (pCVar2->status).m_pages;
      pcVar14 = "\x1b[1;31m";
      dVar17 = 0.0;
      if (sVar6 != 0) {
        pcVar14 = "\x1b[1;33m";
        auVar15._8_4_ = (int)(sVar6 >> 0x20);
        auVar15._0_8_ = sVar6;
        auVar15._12_4_ = 0x45300000;
        auVar16._8_4_ = (int)(sVar7 >> 0x20);
        auVar16._0_8_ = sVar7;
        auVar16._12_4_ = 0x45300000;
        dVar17 = (((auVar15._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) * 100.0) /
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
      }
      if (sVar6 == sVar7) {
        pcVar14 = "\x1b[1;32m";
      }
      sVar8 = (pCVar2->status).m_memory;
      lVar10 = std::chrono::_V2::steady_clock::now();
      Log::print(INFO,
                 "%s\x1b[1;32m READY\x1b[0m threads %s%zu/%zu (%zu)\x1b[0m huge pages %s%1.0f%% %zu/%zu\x1b[0m memory \x1b[1;36m%zu KB\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m"
                 ,dVar17,"\x1b[46;1m\x1b[1;37m cpu \x1b[0m",pcVar12,sVar3,sVar4,sVar5,pcVar14,sVar6,
                 sVar7,sVar8 * sVar5 >> 10,lVar10 / 1000000 - (pCVar2->status).m_ts);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex);
  if (!ready) {
    return;
  }
  (*worker->_vptr_IWorker[8])(worker);
  return;
}

Assistant:

void xmrig::CpuBackend::start(IWorker *worker, bool ready)
{
    mutex.lock();

    if (d_ptr->status.started(worker, ready)) {
        d_ptr->status.print();
    }

    mutex.unlock();

    if (ready) {
        worker->start();
    }
}